

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_strconv.cpp
# Opt level: O2

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
ritobin::strconv_impl::StringIterator::match_str
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          StringIterator *this,string_view what)

{
  char **ppcVar1;
  bool bVar2;
  size_t sVar3;
  
  sVar3 = what._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&this->data_,what);
  if (bVar2) {
    ppcVar1 = &(this->data_)._M_str;
    *ppcVar1 = *ppcVar1 + sVar3;
    (this->data_)._M_len = (this->data_)._M_len - sVar3;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = sVar3;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = what._M_str;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> match_str(std::string_view what) noexcept {
            if (data_.starts_with(what)) {
                data_.remove_prefix(what.size());
                return what;
            } else {
                return std::nullopt;
            }
        }